

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_TakeLastOpt2_Test::TestBody(TApp_TakeLastOpt2_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Option *this_00;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  iterator local_a0;
  size_type local_98;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string str;
  TApp_TakeLastOpt2_Test *this_local;
  
  str.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"--str",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
                       ,&local_88);
  CLI::OptionBase<CLI::Option>::take_last(&this_00->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  gtest_ar.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"--str=one",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"--str=two",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  gtest_ar.message_.ptr_._5_1_ = 0;
  local_a0 = &local_e0;
  local_98 = 2;
  __l._M_len = 2;
  __l._M_array = local_a0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
  do {
    local_160 = local_160 + -1;
    std::__cxx11::string::~string((string *)local_160);
  } while (local_160 != &local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[4]>
            ((EqHelper<false> *)local_100,"str","\"two\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (char (*) [4])0x1cd581);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0xf2,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, TakeLastOpt2) {

    std::string str;
    app.add_option("--str", str)->take_last();

    args = {"--str=one", "--str=two"};

    run();

    EXPECT_EQ(str, "two");
}